

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O3

void __thiscall
QtMWidgets::ScrollArea::ensureVisible(ScrollArea *this,int x,int y,int xmargin,int ymargin)

{
  AbstractScrollAreaPrivate *pAVar1;
  long lVar2;
  LayoutDirection LVar3;
  int iVar4;
  QPoint *pQVar5;
  QSize *pQVar6;
  int iVar7;
  int iVar8;
  QRect local_48;
  QPoint local_38;
  
  pAVar1 = (this->super_AbstractScrollArea).d.d;
  LVar3 = QWidget::layoutDirection();
  lVar2 = *(long *)(pAVar1->viewport + 0x20);
  local_48.x2 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_48.y2 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_48.x1 = 0;
  local_48.y1 = 0;
  local_38.xp = x;
  local_38.yp = y;
  iVar4 = QStyle::visualPos(LVar3,&local_48,&local_38);
  iVar8 = iVar4 - xmargin;
  pQVar5 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
  if (iVar8 < pQVar5->xp) {
    iVar7 = 0;
    if (0 < iVar8) {
      iVar7 = iVar8;
    }
  }
  else {
    pQVar5 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
    iVar8 = *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x1c) -
            *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x14);
    iVar7 = 0;
    if ((pQVar5->xp - xmargin) + iVar8 + 1 < iVar4) {
      iVar7 = (iVar4 + xmargin) - (iVar8 + 1);
      pQVar6 = AbstractScrollArea::scrolledAreaSize(&this->super_AbstractScrollArea);
      if (pQVar6->wd <= iVar7) {
        iVar7 = pQVar6->wd;
      }
    }
  }
  iVar4 = y - ymargin;
  pQVar5 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
  if (iVar4 < pQVar5->yp) {
    iVar8 = 0;
    if (0 < iVar4) {
      iVar8 = iVar4;
    }
  }
  else {
    pQVar5 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
    iVar4 = *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) -
            *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18);
    iVar8 = 0;
    if ((pQVar5->yp - ymargin) + iVar4 + 1 < y) {
      iVar8 = (ymargin + y) - (iVar4 + 1);
      pQVar6 = AbstractScrollArea::scrolledAreaSize(&this->super_AbstractScrollArea);
      if (pQVar6->ht <= iVar8) {
        iVar8 = pQVar6->ht;
      }
    }
  }
  local_48.y1 = iVar8;
  local_48.x1 = iVar7;
  AbstractScrollArea::setTopLeftPointShownArea(&this->super_AbstractScrollArea,(QPoint *)&local_48);
  return;
}

Assistant:

void
ScrollArea::ensureVisible( int x, int y, int xmargin, int ymargin )
{
	ScrollAreaPrivate * d = d_func();

	int logicalX = QStyle::visualPos( layoutDirection(), d->viewport->rect(),
		QPoint( x, y ) ).x();

	int posX = 0;
	int posY = 0;

	if( logicalX - xmargin < topLeftPointShownArea().x() )
		posX = qMax( 0, logicalX - xmargin );
	else if( logicalX > topLeftPointShownArea().x() + d->viewport->width() - xmargin )
		posX = qMin( logicalX - d->viewport->width() + xmargin,
			scrolledAreaSize().width() );

	if( y - ymargin < topLeftPointShownArea().y() )
		posY = qMax( 0, y - ymargin );
	else if( y > topLeftPointShownArea().y() + d->viewport->height() - ymargin )
		posY= qMin( y - d->viewport->height() + ymargin,
			scrolledAreaSize().height() );

	setTopLeftPointShownArea( QPoint( posX, posY ) );
}